

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutionQueue.cpp
# Opt level: O2

ProcessStatus __thiscall
llbuild::basic::ExecutionQueue::executeProcess
          (ExecutionQueue *this,QueueJobContext *context,ArrayRef<llvm::StringRef> commandLine)

{
  ProcessStatus PVar1;
  future<llbuild::basic::ProcessStatus> result;
  undefined4 local_b0;
  undefined4 uStack_98;
  promise<llbuild::basic::ProcessStatus> p;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> local_58;
  
  std::promise<llbuild::basic::ProcessStatus>::promise(&p);
  std::__basic_future<llbuild::basic::ProcessStatus>::__basic_future
            (&result.super___basic_future<llbuild::basic::ProcessStatus>,&p._M_future);
  local_b0 = CONCAT22(local_b0._2_2_,1);
  uStack_98 = CONCAT22(uStack_98._2_2_,0x101);
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/ExecutionQueue.cpp:45:19)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/ExecutionQueue.cpp:45:19)>
             ::_M_manager;
  local_78._M_unused._0_8_ = (undefined8)&p;
  llvm::optional_detail::OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>
  ::OptionalStorage(&local_58,(function<void_(llbuild::basic::ProcessResult)> *)&local_78);
  (*this->_vptr_ExecutionQueue[4])
            (this,context,commandLine.Data,commandLine.Length,0,0,local_b0,0,0,uStack_98,&local_58,0
            );
  llvm::optional_detail::OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>
  ::reset(&local_58);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  PVar1 = std::future<llbuild::basic::ProcessStatus>::get(&result);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&result.super___basic_future<llbuild::basic::ProcessStatus>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<llbuild::basic::ProcessStatus>::~promise(&p);
  return PVar1;
}

Assistant:

ProcessStatus ExecutionQueue::executeProcess(QueueJobContext* context,
                                             ArrayRef<StringRef> commandLine) {
  std::promise<ProcessStatus> p;
  auto result = p.get_future();
  executeProcess(context, commandLine, {}, {true},
                 {[&p](ProcessResult result) mutable {
    p.set_value(result.status);
  }});
  return result.get();
}